

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O0

void __thiscall
quickpool::sched::TaskManager::push<std::_Bind<main::__1(unsigned_long)>>
          (TaskManager *this,
          _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_tnagler[P]quickpool_test_cpp:38:27)_(unsigned_long)>
          *task)

{
  bool bVar1;
  __int_type_conflict _Var2;
  reference this_00;
  Task local_50;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_tnagler[P]quickpool_test_cpp:38:27)_(unsigned_long)>
  *local_30;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_tnagler[P]quickpool_test_cpp:38:27)_(unsigned_long)>
  *task_local;
  TaskManager *this_local;
  undefined4 local_18;
  undefined4 local_14;
  atomic<int,_64UL> *local_10;
  
  local_30 = task;
  task_local = (_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_tnagler[P]quickpool_test_cpp:38:27)_(unsigned_long)>
                *)this;
  rethrow_exception(this);
  bVar1 = is_running(this);
  if (bVar1) {
    local_10 = &this->todo_;
    local_14 = 1;
    local_18 = 3;
    this_local._4_4_ = 1;
    LOCK();
    this_local._0_4_ = (local_10->super_atomic<int>).super___atomic_base<int>._M_i;
    (local_10->super_atomic<int>).super___atomic_base<int>._M_i =
         (local_10->super_atomic<int>).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    _Var2 = std::__atomic_base<unsigned_long>::operator++
                      ((__atomic_base<unsigned_long> *)&this->push_idx_,0);
    this_00 = std::
              vector<quickpool::sched::TaskQueue,_quickpool::mem::aligned::allocator<quickpool::sched::TaskQueue,_64UL>_>
              ::operator[](&this->queues_,_Var2 % this->num_queues_);
    std::function<void()>::function<std::_Bind<main::__1(unsigned_long)>&,void>
              ((function<void()> *)&local_50,local_30);
    TaskQueue::push(this_00,&local_50);
    std::function<void_()>::~function(&local_50);
  }
  return;
}

Assistant:

void push(Task&& task)
    {
        rethrow_exception(); // push() throws if a task has errored.
        if (is_running()) {
            todo_.fetch_add(1, mem::release);
            queues_[push_idx_++ % num_queues_].push(task);
        }
    }